

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckedOffsetReader.h
# Opt level: O1

void __thiscall CheckedOffsetReader::setpos(CheckedOffsetReader *this,uint64_t off)

{
  element_type *peVar1;
  undefined8 *puVar2;
  
  if (off <= this->_size) {
    peVar1 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_ReadWriter[4])(peVar1,this->_baseofs + off);
    this->_curpos = off;
    return;
  }
  printf("setpos(%llx) [%llx .. %llx]\n",off,this->_baseofs);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "setpos beyond limit";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

virtual void setpos(uint64_t off)
    {
        if (off>_size) {
            printf("setpos(%llx) [%llx .. %llx]\n", off, _baseofs, _size);
            throw "setpos beyond limit";
        }
        _r->setpos(off+_baseofs);
        _curpos= off;
    }